

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

void __thiscall Pathie::Path::rmtree(Path *this)

{
  bool bVar1;
  reference path;
  char *in_RSI;
  __normal_iterator<Pathie::Path_*,_std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>_>
  *__rhs;
  Path local_88;
  Path local_68;
  __normal_iterator<Pathie::Path_*,_std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>_>
  local_48 [3];
  __normal_iterator<Pathie::Path_*,_std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>_>
  local_30;
  iterator iter;
  vector<Pathie::Path,_std::allocator<Pathie::Path>_> kids;
  Path *this_local;
  
  bVar1 = is_directory(this);
  if (bVar1) {
    children((vector<Pathie::Path,_std::allocator<Pathie::Path>_> *)&iter,this);
    local_30._M_current =
         (Path *)std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::begin
                           ((vector<Pathie::Path,_std::allocator<Pathie::Path>_> *)&iter);
    while( true ) {
      local_48[0]._M_current =
           (Path *)std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::end
                             ((vector<Pathie::Path,_std::allocator<Pathie::Path>_> *)&iter);
      __rhs = local_48;
      bVar1 = __gnu_cxx::operator!=(&local_30,__rhs);
      if (!bVar1) break;
      path = __gnu_cxx::
             __normal_iterator<Pathie::Path_*,_std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>_>
             ::operator*(&local_30);
      Path(&local_88,path);
      join(&local_68,this,&local_88);
      rmtree(&local_68);
      ~Path(&local_68);
      ~Path(&local_88);
      __gnu_cxx::
      __normal_iterator<Pathie::Path_*,_std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>_>::
      operator++(&local_30,0);
    }
    rmdir(this,(char *)__rhs);
    std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::~vector
              ((vector<Pathie::Path,_std::allocator<Pathie::Path>_> *)&iter);
  }
  else {
    unlink(this,in_RSI);
  }
  return;
}

Assistant:

void Path::rmtree() const
{
  if (is_directory()) {
    std::vector<Path> kids = children();

    for(std::vector<Path>::iterator iter=kids.begin(); iter != kids.end(); iter++) {
       join(*iter).rmtree();
    }

    rmdir();
  }
  else { // file or similar
    unlink();
  }
}